

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O3

bool __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::rehash_on_extreme_load
          (robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
           *this,distance_type curr_dist_from_ideal_bucket)

{
  bool bVar1;
  size_t count_;
  undefined6 in_register_00000032;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  
  if ((((int)CONCAT62(in_register_00000032,curr_dist_from_ideal_bucket) < 0x2001) &&
      (this->m_grow_on_next_insert == false)) &&
     (uVar2 = this->m_nb_elements, uVar2 < this->m_load_threshold)) {
    if (this->m_try_shrink_on_next_insert == true) {
      this->m_try_shrink_on_next_insert = false;
      fVar4 = this->m_min_load_factor;
      if ((fVar4 != 0.0) || (NAN(fVar4))) {
        fVar5 = 0.0;
        if (this->m_bucket_count != 0) {
          fVar5 = (float)uVar2 / (float)this->m_bucket_count;
        }
        if (fVar5 < fVar4) {
          fVar4 = this->m_max_load_factor;
          fVar5 = ceilf((float)(uVar2 + 1) / fVar4);
          uVar3 = (long)(fVar5 - 9.223372e+18) & (long)fVar5 >> 0x3f | (long)fVar5;
          fVar4 = ceilf((float)uVar2 / fVar4);
          uVar2 = (long)(fVar4 - 9.223372e+18) & (long)fVar4 >> 0x3f | (long)fVar4;
          if (uVar2 <= uVar3) {
            uVar2 = uVar3;
          }
          rehash_impl(this,uVar2);
          goto LAB_001dc2dd;
        }
      }
    }
    bVar1 = false;
  }
  else {
    count_ = rh::power_of_two_growth_policy<2UL>::next_bucket_count
                       (&this->super_power_of_two_growth_policy<2UL>);
    rehash_impl(this,count_);
    this->m_grow_on_next_insert = false;
LAB_001dc2dd:
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool rehash_on_extreme_load(distance_type curr_dist_from_ideal_bucket) {
    if (m_grow_on_next_insert ||
        curr_dist_from_ideal_bucket >
            bucket_entry::DIST_FROM_IDEAL_BUCKET_LIMIT ||
        size() >= m_load_threshold) {
      rehash_impl(GrowthPolicy::next_bucket_count());
      m_grow_on_next_insert = false;

      return true;
    }

    if (m_try_shrink_on_next_insert) {
      m_try_shrink_on_next_insert = false;
      if (m_min_load_factor != 0.0f && load_factor() < m_min_load_factor) {
        reserve(size() + 1);

        return true;
      }
    }

    return false;
  }